

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Diagnostic * slang::ast::operator<<(Diagnostic *diag,Type *arg)

{
  Diagnostic *in_RDI;
  type_index *in_stack_ffffffffffffff98;
  pair<std::type_index,_std::any> *this;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  *this_00;
  undefined1 local_30 [40];
  Diagnostic *local_8;
  
  this = (pair<std::type_index,_std::any> *)local_30;
  local_8 = in_RDI;
  std::type_index::type_index((type_index *)this,(type_info *)&Type_const*::typeinfo);
  this_00 = (vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             *)(local_30 + 8);
  std::pair<std::type_index,_std::any>::pair<std::type_index,_const_slang::ast::Type_*,_true>
            (this,in_stack_ffffffffffffff98,(Type **)0x739313);
  std::
  vector<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>,std::allocator<std::variant<std::__cxx11::string,long,unsigned_long,char,slang::ConstantValue,std::pair<std::type_index,std::any>>>>
  ::emplace_back<std::pair<std::type_index,std::any>>
            (this_00,(pair<std::type_index,_std::any> *)in_RDI);
  std::pair<std::type_index,_std::any>::~pair((pair<std::type_index,_std::any> *)0x73932e);
  return local_8;
}

Assistant:

Diagnostic& operator<<(Diagnostic& diag, const Type& arg) {
    SLANG_ASSERT(!arg.isError());
    diag.args.emplace_back(Diagnostic::CustomArgType{SLANG_TYPEOF(const Type*), &arg});
    return diag;
}